

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# in_memory_log_store.cxx
# Opt level: O0

ptr<log_entry> __thiscall nuraft::inmem_log_store::last_entry(inmem_log_store *this)

{
  bool bVar1;
  long lVar2;
  const_iterator entry_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long *in_RSI;
  element_type *in_RDI;
  ptr<log_entry> pVar3;
  const_iterator entry;
  lock_guard<std::mutex> l;
  ulong next_idx;
  map<unsigned_long,_std::shared_ptr<nuraft::log_entry>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::log_entry>_>_>_>
  *in_stack_ffffffffffffff78;
  lock_guard<std::mutex> *in_stack_ffffffffffffff80;
  _Self local_48 [3];
  long local_30;
  
  lVar2 = (**(code **)(*in_RSI + 0x10))();
  std::lock_guard<std::mutex>::lock_guard
            (in_stack_ffffffffffffff80,(mutex_type *)in_stack_ffffffffffffff78);
  local_30 = lVar2 + -1;
  entry_00 = std::
             map<unsigned_long,_std::shared_ptr<nuraft::log_entry>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::log_entry>_>_>_>
             ::find(in_stack_ffffffffffffff78,(key_type *)0x19756c);
  local_48[0]._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_std::shared_ptr<nuraft::log_entry>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::log_entry>_>_>_>
       ::end(in_stack_ffffffffffffff78);
  bVar1 = std::operator==((_Self *)&stack0xffffffffffffffd8,local_48);
  if (bVar1) {
    entry_00 = std::
               map<unsigned_long,_std::shared_ptr<nuraft::log_entry>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::log_entry>_>_>_>
               ::find(in_stack_ffffffffffffff78,(key_type *)0x1975c1);
  }
  std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::log_entry>_>_>
  ::operator->((_Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::log_entry>_>_>
                *)0x197602);
  make_clone((ptr<log_entry> *)entry_00._M_node);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x19761f);
  pVar3.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar3.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (ptr<log_entry>)pVar3.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<log_entry> inmem_log_store::last_entry() const {
    ulong next_idx = next_slot();
    std::lock_guard<std::mutex> l(logs_lock_);
    auto entry = logs_.find( next_idx - 1 );
    if (entry == logs_.end()) {
        entry = logs_.find(0);
    }

    return make_clone(entry->second);
}